

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O1

int __thiscall ncnn::Gemm_x86::create_pipeline(Gemm_x86 *this,Option *opt)

{
  Mat *dst;
  _func_int *p_Var1;
  size_t sVar2;
  int *piVar3;
  void *pvVar4;
  Allocator *pAVar5;
  _func_int **pp_Var6;
  int max_kk;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  bool bVar18;
  int TILE_K;
  int TILE_M;
  Mat local_98;
  ulong local_50;
  int TILE_N;
  Option *local_40;
  ulong local_38;
  
  p_Var1 = this->_vptr_Gemm_x86[-3];
  if (*(int *)(p_Var1 + 0x40 + (long)&(this->CT_data).data) == 0) {
LAB_004d74b2:
    p_Var1 = this->_vptr_Gemm_x86[-3];
    if (*(int *)(p_Var1 + 0x44 + (long)&(this->CT_data).data) != 0) {
      uVar11 = *(uint *)(&this->field_0xf0 + (long)p_Var1);
      iVar9 = *(int *)(&this->field_0xf4 + (long)p_Var1);
      local_40 = opt;
      get_optimal_tile_mnk
                (0,uVar11,iVar9,*(int *)(&this->field_0x10c + (long)p_Var1),
                 *(int *)(&this->field_0x110 + (long)p_Var1),
                 *(int *)(&this->field_0x114 + (long)p_Var1),&TILE_M,&TILE_N,&TILE_K,
                 opt->num_threads);
      iVar15 = (int)(TILE_N + uVar11 + -1) / TILE_N;
      iVar14 = (iVar9 + TILE_K + -1) / TILE_K;
      local_50 = (ulong)uVar11;
      Mat::create(&this->BT_data,TILE_K * TILE_N,iVar14,iVar15,4,(Allocator *)0x0);
      if ((this->BT_data).data == (void *)0x0) {
        bVar18 = true;
      }
      else {
        bVar18 = (long)(this->BT_data).c * (this->BT_data).cstep == 0;
      }
      if (bVar18) goto LAB_004d757a;
      iVar15 = iVar15 * iVar14;
      if (0 < iVar15) {
        iVar16 = 0;
        do {
          iVar10 = TILE_N * (iVar16 / iVar14);
          iVar13 = TILE_K * (int)((long)iVar16 % (long)iVar14);
          iVar17 = (int)local_50 - iVar10;
          if (TILE_N < iVar17) {
            iVar17 = TILE_N;
          }
          max_kk = iVar9 - iVar13;
          if (TILE_K < iVar9 - iVar13) {
            max_kk = TILE_K;
          }
          local_98.w = (this->BT_data).w;
          local_98.cstep = (size_t)local_98.w;
          sVar2 = (this->BT_data).elemsize;
          local_98.elempack = (this->BT_data).elempack;
          local_98.data =
               (void *)((long)(this->BT_data).data +
                       ((long)iVar16 % (long)iVar14 & 0xffffffffU) * local_98.cstep * sVar2 +
                       (long)(iVar16 / iVar14) * (this->BT_data).cstep * sVar2);
          local_98.allocator = (this->BT_data).allocator;
          local_98.refcount._0_4_ = 0;
          local_98.refcount._4_4_ = 0;
          local_98.elemsize._0_4_ = (undefined4)sVar2;
          local_98.elemsize._4_4_ = (undefined4)(sVar2 >> 0x20);
          local_98.dims = 2;
          local_98.h = 1;
          local_98.d = 1;
          local_98.c = 1;
          if (*(int *)(this->_vptr_Gemm_x86[-3] + 0x3c + (long)&(this->CT_data).data) == 0) {
            transpose_pack_B_tile
                      ((Mat *)(&this->field_0x160 + (long)this->_vptr_Gemm_x86[-3]),&local_98,iVar10
                       ,iVar17,iVar13,max_kk);
          }
          else {
            pack_B_tile((Mat *)(&this->field_0x160 + (long)this->_vptr_Gemm_x86[-3]),&local_98,
                        iVar10,iVar17,iVar13,max_kk);
          }
          piVar3 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (local_98.allocator == (Allocator *)0x0) {
                if (local_98.data != (void *)0x0) {
                  free(local_98.data);
                }
              }
              else {
                (*(local_98.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_98.cstep = 0;
          local_98.data = (void *)0x0;
          local_98.refcount._0_4_ = 0;
          local_98.refcount._4_4_ = 0;
          local_98.elemsize._0_4_ = 0;
          local_98.elemsize._4_4_ = 0;
          local_98.elempack = 0;
          local_98.dims = 0;
          local_98.w = 0;
          local_98.h = 0;
          local_98.d = 0;
          local_98.c = 0;
          iVar16 = iVar16 + 1;
        } while (iVar15 != iVar16);
      }
      opt = local_40;
      if (local_40->lightmode != false) {
        p_Var1 = this->_vptr_Gemm_x86[-3];
        piVar3 = *(int **)(&this->field_0x168 + (long)p_Var1);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (*(long **)(&this->field_0x180 + (long)p_Var1) == (long *)0x0) {
              if (*(void **)(&this->field_0x160 + (long)p_Var1) != (void *)0x0) {
                free(*(void **)(&this->field_0x160 + (long)p_Var1));
              }
            }
            else {
              (**(code **)(**(long **)(&this->field_0x180 + (long)p_Var1) + 0x18))();
            }
          }
        }
        *(undefined8 *)(&this->field_0x1a0 + (long)p_Var1) = 0;
        *(undefined8 *)(&this->field_0x16c + (long)p_Var1) = 0;
        *(undefined8 *)(&this->field_0x174 + (long)p_Var1) = 0;
        *(undefined8 *)(&this->field_0x160 + (long)p_Var1) = 0;
        *(undefined8 *)(&this->field_0x168 + (long)p_Var1) = 0;
        *(undefined8 *)(&this->field_0x188 + (long)p_Var1) = 0;
        *(undefined8 *)(&this->field_0x190 + (long)p_Var1) = 0;
        *(undefined4 *)(&this->field_0x198 + (long)p_Var1) = 0;
      }
      if (bVar18) {
        return -100;
      }
    }
    p_Var1 = this->_vptr_Gemm_x86[-3];
    if ((*(int *)(&this->field_0xe8 + (long)p_Var1) != 0) &&
       (*(int *)(&this->field_0xf8 + (long)p_Var1) != -1)) {
      dst = &this->CT_data;
      if (p_Var1 != (_func_int *)0xfffffffffffffef8) {
        piVar3 = *(int **)(&this->field_0x1b0 + (long)p_Var1);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        piVar3 = (this->CT_data).refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            pvVar4 = (this->CT_data).data;
            pAVar5 = (this->CT_data).allocator;
            if (pAVar5 == (Allocator *)0x0) {
              if (pvVar4 != (void *)0x0) {
                free(pvVar4);
              }
            }
            else {
              (*pAVar5->_vptr_Allocator[3])();
            }
          }
        }
        (this->CT_data).cstep = 0;
        *(undefined8 *)((long)&(this->CT_data).refcount + 4) = 0;
        *(undefined8 *)((long)&(this->CT_data).elemsize + 4) = 0;
        dst->data = (void *)0x0;
        (this->CT_data).refcount = (int *)0x0;
        (this->CT_data).dims = 0;
        (this->CT_data).w = 0;
        (this->CT_data).h = 0;
        (this->CT_data).d = 0;
        (this->CT_data).c = 0;
        piVar3 = *(int **)((long)(&this->field_0x1a8 + (long)p_Var1) + 8);
        (this->CT_data).data = *(void **)(&this->field_0x1a8 + (long)p_Var1);
        (this->CT_data).refcount = piVar3;
        (this->CT_data).elemsize = *(size_t *)(&this->field_0x1b8 + (long)p_Var1);
        (this->CT_data).elempack = *(int *)(&this->field_0x1c0 + (long)p_Var1);
        (this->CT_data).allocator = *(Allocator **)(&this->field_0x1c8 + (long)p_Var1);
        uVar7 = *(undefined8 *)(&this->field_0x1d0 + (long)p_Var1);
        uVar8 = *(undefined8 *)((long)(&this->field_0x1d0 + (long)p_Var1) + 8);
        (this->CT_data).dims = (int)uVar7;
        (this->CT_data).w = (int)((ulong)uVar7 >> 0x20);
        (this->CT_data).h = (int)uVar8;
        (this->CT_data).d = (int)((ulong)uVar8 >> 0x20);
        (this->CT_data).c = *(int *)(&this->field_0x1e0 + (long)p_Var1);
        (this->CT_data).cstep = *(size_t *)(&this->field_0x1e8 + (long)p_Var1);
      }
      p_Var1 = this->_vptr_Gemm_x86[-3];
      if ((*(int *)(&this->field_0xf8 + (long)p_Var1) == 3) && (opt->use_packing_layout == true)) {
        convert_packing((Mat *)(&this->field_0x1a8 + (long)p_Var1),dst,
                        (uint)(((&this->field_0xec)[(long)p_Var1] & 3) == 0) * 3 + 1,opt);
      }
      if (*(float *)(this->_vptr_Gemm_x86[-3] + 0x34 + (long)&(this->CT_data).data) != 1.0) {
        local_98.cstep = 0;
        local_98.data = (void *)0x0;
        local_98.refcount._0_4_ = 0;
        local_98.refcount._4_4_ = 0;
        local_98.elemsize._0_4_ = 0;
        local_98.elemsize._4_4_ = 0;
        local_98.elempack = 0;
        local_98.allocator = (Allocator *)0x0;
        local_98.dims = 0;
        local_98.w = 0;
        local_98.h = 0;
        local_98.d = 0;
        local_98.c = 0;
        Mat::create_like(&local_98,dst,(Allocator *)0x0);
        uVar11 = (this->CT_data).c * (int)(this->CT_data).cstep * (this->CT_data).elempack;
        if (0 < (int)uVar11) {
          pp_Var6 = this->_vptr_Gemm_x86;
          pvVar4 = (this->CT_data).data;
          uVar12 = 0;
          do {
            *(float *)((long)local_98.data + uVar12 * 4) =
                 *(float *)(pp_Var6[-3] + 0x34 + (long)&(this->CT_data).data) *
                 *(float *)((long)pvVar4 + uVar12 * 4);
            uVar12 = uVar12 + 1;
          } while (uVar11 != uVar12);
        }
        if (dst != &local_98) {
          piVar3 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + 1;
            UNLOCK();
          }
          piVar3 = (this->CT_data).refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              pvVar4 = (this->CT_data).data;
              pAVar5 = (this->CT_data).allocator;
              if (pAVar5 == (Allocator *)0x0) {
                if (pvVar4 != (void *)0x0) {
                  free(pvVar4);
                }
              }
              else {
                (*pAVar5->_vptr_Allocator[3])();
              }
            }
          }
          (this->CT_data).cstep = 0;
          *(undefined8 *)((long)&(this->CT_data).refcount + 4) = 0;
          *(undefined8 *)((long)&(this->CT_data).elemsize + 4) = 0;
          dst->data = (void *)0x0;
          (this->CT_data).refcount = (int *)0x0;
          (this->CT_data).dims = 0;
          (this->CT_data).w = 0;
          (this->CT_data).h = 0;
          (this->CT_data).d = 0;
          (this->CT_data).c = 0;
          (this->CT_data).data = local_98.data;
          (this->CT_data).refcount =
               (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
          (this->CT_data).elemsize = CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize)
          ;
          (this->CT_data).elempack = local_98.elempack;
          (this->CT_data).allocator = local_98.allocator;
          (this->CT_data).dims = local_98.dims;
          (this->CT_data).w = local_98.w;
          (this->CT_data).h = local_98.h;
          (this->CT_data).d = local_98.d;
          (this->CT_data).c = local_98.c;
          (this->CT_data).cstep = local_98.cstep;
        }
        piVar3 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (local_98.allocator == (Allocator *)0x0) {
              if (local_98.data != (void *)0x0) {
                free(local_98.data);
              }
            }
            else {
              (*(local_98.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_98.cstep = 0;
        local_98.data = (void *)0x0;
        local_98.refcount._0_4_ = 0;
        local_98.refcount._4_4_ = 0;
        local_98.elemsize._0_4_ = 0;
        local_98.elemsize._4_4_ = 0;
        local_98.elempack = 0;
        local_98.dims = 0;
        local_98.w = 0;
        local_98.h = 0;
        local_98.d = 0;
        local_98.c = 0;
      }
      if (opt->lightmode == true) {
        p_Var1 = this->_vptr_Gemm_x86[-3];
        piVar3 = *(int **)(&this->field_0x1b0 + (long)p_Var1);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (*(long **)(&this->field_0x1c8 + (long)p_Var1) == (long *)0x0) {
              if (*(void **)(&this->field_0x1a8 + (long)p_Var1) != (void *)0x0) {
                free(*(void **)(&this->field_0x1a8 + (long)p_Var1));
              }
            }
            else {
              (**(code **)(**(long **)(&this->field_0x1c8 + (long)p_Var1) + 0x18))();
            }
          }
        }
        *(undefined8 *)(&this->field_0x1e8 + (long)p_Var1) = 0;
        *(undefined8 *)(&this->field_0x1b4 + (long)p_Var1) = 0;
        *(undefined8 *)(&this->field_0x1bc + (long)p_Var1) = 0;
        *(undefined8 *)(&this->field_0x1a8 + (long)p_Var1) = 0;
        *(undefined8 *)(&this->field_0x1b0 + (long)p_Var1) = 0;
        *(undefined8 *)(&this->field_0x1d0 + (long)p_Var1) = 0;
        *(undefined8 *)(&this->field_0x1d8 + (long)p_Var1) = 0;
        *(undefined4 *)(&this->field_0x1e0 + (long)p_Var1) = 0;
      }
    }
    p_Var1 = this->_vptr_Gemm_x86[-3];
    if (((*(int *)(p_Var1 + 0x40 + (long)&(this->CT_data).data) != 0) ||
        (*(int *)(p_Var1 + 0x44 + (long)&(this->CT_data).data) != 0)) ||
       (*(int *)(&this->field_0xe8 + (long)p_Var1) != 0)) {
      this->nT = opt->num_threads;
    }
    iVar9 = 0;
  }
  else {
    uVar11 = *(uint *)(&this->field_0xec + (long)p_Var1);
    iVar9 = *(int *)(&this->field_0xf4 + (long)p_Var1);
    get_optimal_tile_mnk
              (uVar11,0,iVar9,*(int *)(&this->field_0x10c + (long)p_Var1),
               *(int *)(&this->field_0x110 + (long)p_Var1),
               *(int *)(&this->field_0x114 + (long)p_Var1),&TILE_M,&TILE_N,&TILE_K,opt->num_threads)
    ;
    iVar14 = (int)(TILE_M + uVar11 + -1) / TILE_M;
    local_38 = (ulong)uVar11;
    Mat::create(&this->AT_data,TILE_M * TILE_K,(iVar9 + TILE_K + -1) / TILE_K,iVar14,4,
                (Allocator *)0x0);
    if ((this->AT_data).data == (void *)0x0) {
      bVar18 = true;
    }
    else {
      bVar18 = (long)(this->AT_data).c * (this->AT_data).cstep == 0;
    }
    if (!bVar18) {
      local_40 = opt;
      if (0 < iVar14) {
        local_50 = local_50 & 0xffffffff00000000;
        do {
          if (0 < iVar9) {
            iVar16 = TILE_M * (int)local_50;
            iVar15 = (int)local_38 - iVar16;
            iVar17 = 0;
            do {
              iVar10 = iVar15;
              if (TILE_M < iVar15) {
                iVar10 = TILE_M;
              }
              iVar13 = iVar9 - iVar17;
              if (TILE_K < iVar9 - iVar17) {
                iVar13 = TILE_K;
              }
              local_98.w = (this->AT_data).w;
              local_98.cstep = (size_t)local_98.w;
              sVar2 = (this->AT_data).elemsize;
              local_98.elempack = (this->AT_data).elempack;
              local_98.allocator = (this->AT_data).allocator;
              local_98.data =
                   (void *)((long)(this->AT_data).data +
                           sVar2 * local_98.cstep * (long)(iVar17 / TILE_K) +
                           (long)(iVar16 / TILE_M) * (this->AT_data).cstep * sVar2);
              local_98.refcount._0_4_ = 0;
              local_98.refcount._4_4_ = 0;
              local_98.elemsize._0_4_ = (undefined4)sVar2;
              local_98.elemsize._4_4_ = (undefined4)(sVar2 >> 0x20);
              local_98.dims = 2;
              local_98.h = 1;
              local_98.d = 1;
              local_98.c = 1;
              if (*(int *)(this->_vptr_Gemm_x86[-3] + 0x38 + (long)&(this->CT_data).data) == 0) {
                pack_A_tile((Mat *)(&this->field_0x118 + (long)this->_vptr_Gemm_x86[-3]),&local_98,
                            iVar16,iVar10,iVar17,iVar13);
              }
              else {
                transpose_pack_A_tile
                          ((Mat *)(&this->field_0x118 + (long)this->_vptr_Gemm_x86[-3]),&local_98,
                           iVar16,iVar10,iVar17,iVar13);
              }
              piVar3 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
              if (piVar3 != (int *)0x0) {
                LOCK();
                *piVar3 = *piVar3 + -1;
                UNLOCK();
                if (*piVar3 == 0) {
                  if (local_98.allocator == (Allocator *)0x0) {
                    if (local_98.data != (void *)0x0) {
                      free(local_98.data);
                    }
                  }
                  else {
                    (*(local_98.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              local_98.cstep = 0;
              local_98.data = (void *)0x0;
              local_98.refcount._0_4_ = 0;
              local_98.refcount._4_4_ = 0;
              local_98.elemsize._0_4_ = 0;
              local_98.elemsize._4_4_ = 0;
              local_98.elempack = 0;
              local_98.dims = 0;
              local_98.w = 0;
              local_98.h = 0;
              local_98.d = 0;
              local_98.c = 0;
              iVar17 = iVar17 + TILE_K;
            } while (iVar17 < iVar9);
          }
          iVar15 = (int)local_50 + 1;
          local_50 = CONCAT44(local_50._4_4_,iVar15);
        } while (iVar15 != iVar14);
      }
      opt = local_40;
      if (local_40->lightmode != false) {
        p_Var1 = this->_vptr_Gemm_x86[-3];
        piVar3 = *(int **)(&this->field_0x120 + (long)p_Var1);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (*(long **)(&this->field_0x138 + (long)p_Var1) == (long *)0x0) {
              if (*(void **)(&this->field_0x118 + (long)p_Var1) != (void *)0x0) {
                free(*(void **)(&this->field_0x118 + (long)p_Var1));
              }
            }
            else {
              (**(code **)(**(long **)(&this->field_0x138 + (long)p_Var1) + 0x18))();
            }
          }
        }
        *(undefined8 *)(&this->field_0x158 + (long)p_Var1) = 0;
        *(undefined8 *)(&this->field_0x124 + (long)p_Var1) = 0;
        *(undefined8 *)(&this->field_0x12c + (long)p_Var1) = 0;
        *(undefined8 *)(&this->field_0x118 + (long)p_Var1) = 0;
        *(undefined8 *)(&this->field_0x120 + (long)p_Var1) = 0;
        *(undefined8 *)(&this->field_0x140 + (long)p_Var1) = 0;
        *(undefined8 *)(&this->field_0x148 + (long)p_Var1) = 0;
        *(undefined4 *)(&this->field_0x150 + (long)p_Var1) = 0;
      }
      if (bVar18) {
        return -100;
      }
      goto LAB_004d74b2;
    }
LAB_004d757a:
    iVar9 = -100;
  }
  return iVar9;
}

Assistant:

int Gemm_x86::create_pipeline(const Option& opt)
{
    if (constantA)
    {
        const int M = constantM;
        const int K = constantK;

        int TILE_M, TILE_N, TILE_K;
        get_optimal_tile_mnk(M, 0, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, opt.num_threads);

        const int nn_M = (M + TILE_M - 1) / TILE_M;

        AT_data.create(TILE_K * TILE_M, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 4u, (Allocator*)0);
        if (AT_data.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ppj = 0; ppj < nn_M; ppj++)
        {
            const int i = ppj * TILE_M;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_ii = std::min((M - i), TILE_M);
                const int max_kk = std::min((K - k), TILE_K);

                Mat AT_tile = AT_data.channel(i / TILE_M).row_range(k / TILE_K, 1);

                if (transA)
                {
                    transpose_pack_A_tile(A_data, AT_tile, i, max_ii, k, max_kk);
                }
                else
                {
                    pack_A_tile(A_data, AT_tile, i, max_ii, k, max_kk);
                }
            }
        }

        if (opt.lightmode)
        {
            A_data.release();
        }
    }

    if (constantB)
    {
        const int N = constantN;
        const int K = constantK;

        int TILE_M, TILE_N, TILE_K;
        get_optimal_tile_mnk(0, N, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, opt.num_threads);

        const int nn_N = (N + TILE_N - 1) / TILE_N;
        const int nn_K = (K + TILE_K - 1) / TILE_K;

        BT_data.create(TILE_K * TILE_N, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 4u, (Allocator*)0);
        if (BT_data.empty())
            return -100;

        const int nn_NK = nn_N * nn_K;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            Mat BT_tile = BT_data.channel(j / TILE_N).row_range(k / TILE_K, 1);

            if (transB)
            {
                pack_B_tile(B_data, BT_tile, j, max_jj, k, max_kk);
            }
            else
            {
                transpose_pack_B_tile(B_data, BT_tile, j, max_jj, k, max_kk);
            }
        }

        if (opt.lightmode)
        {
            B_data.release();
        }
    }

    if (constantC && constant_broadcast_type_C != -1)
    {
        CT_data = C_data;

#if __SSE2__
        if (constant_broadcast_type_C == 3 && opt.use_packing_layout)
        {
#if __AVX512F__
            int C_elempack = constantM % 16 == 0 ? 16 : constantM % 8 == 0 ? 8 : constantM % 4 == 0 ? 4 : 1;
#elif __AVX__
            int C_elempack = constantM % 8 == 0 ? 8 : constantM % 4 == 0 ? 4 : 1;
#else
            int C_elempack = constantM % 4 == 0 ? 4 : 1;
#endif
            convert_packing(C_data, CT_data, C_elempack, opt);
        }
#endif // __SSE2__

        // pre-multiply C with beta
        if (beta != 1.f)
        {
            Mat C2;
            C2.create_like(CT_data);

            const int size = CT_data.total() * CT_data.elempack;
            for (int i = 0; i < size; i++)
            {
                C2[i] = CT_data[i] * beta;
            }

            CT_data = C2;
        }

        if (opt.lightmode)
        {
            C_data.release();
        }
    }

    if (constantA || constantB || constantC)
    {
        nT = opt.num_threads;
    }

    return 0;
}